

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O1

void __thiscall
qclab::qgates::SWAP<std::complex<float>_>::apply
          (SWAP<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  vector<int,_std::allocator<int>_> qubits;
  anon_class_8_1_703dd281_conflict1 f;
  int *local_40 [2];
  long local_30;
  anon_class_8_1_703dd281_conflict1 local_28;
  
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[5])
            (local_40,this);
  *local_40[0] = *local_40[0] + offset;
  local_40[0][1] = local_40[0][1] + offset;
  local_28.vector = *(complex<float> **)vector;
  apply4bc<qclab::qgates::lambda_SWAP<std::complex<float>>(qclab::Op,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_40[0],local_40[0][1],&local_28);
  if (local_40[0] != (int *)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
  }
  return;
}

Assistant:

void SWAP< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                         const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_SWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }